

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeDirectoryCommand.cxx
# Opt level: O2

void __thiscall
cmIncludeDirectoryCommand::NormalizeInclude(cmIncludeDirectoryCommand *this,string *inc)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  string *psVar4;
  string tmp;
  
  uVar2 = std::__cxx11::string::find_first_not_of((char *)inc,0x46ed28);
  lVar3 = std::__cxx11::string::find_last_not_of((char *)inc,0x46ed28);
  if (lVar3 == -1 || uVar2 == 0xffffffffffffffff) {
    inc->_M_string_length = 0;
    *(inc->_M_dataplus)._M_p = '\0';
  }
  else {
    std::__cxx11::string::assign((string *)inc,(ulong)inc,uVar2);
    bVar1 = cmSystemTools::IsOff(inc);
    if (!bVar1) {
      cmsys::SystemTools::ConvertToUnixSlashes(inc);
      bVar1 = cmsys::SystemTools::FileIsFullPath(inc);
      if (!bVar1) {
        bVar1 = cmGeneratorExpression::StartsWithGeneratorExpression(inc);
        if (!bVar1) {
          psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                             ((this->super_cmCommand).Makefile);
          std::__cxx11::string::string((string *)&tmp,(string *)psVar4);
          std::__cxx11::string::append((char *)&tmp);
          std::__cxx11::string::append((string *)&tmp);
          std::__cxx11::string::_M_assign((string *)inc);
          std::__cxx11::string::~string((string *)&tmp);
        }
      }
    }
  }
  return;
}

Assistant:

void cmIncludeDirectoryCommand::NormalizeInclude(std::string& inc)
{
  std::string::size_type b = inc.find_first_not_of(" \r");
  std::string::size_type e = inc.find_last_not_of(" \r");
  if ((b != std::string::npos) && (e != std::string::npos)) {
    inc.assign(inc, b, 1 + e - b); // copy the remaining substring
  } else {
    inc.clear();
    return;
  }

  if (!cmSystemTools::IsOff(inc)) {
    cmSystemTools::ConvertToUnixSlashes(inc);

    if (!cmSystemTools::FileIsFullPath(inc)) {
      if (!cmGeneratorExpression::StartsWithGeneratorExpression(inc)) {
        std::string tmp = this->Makefile->GetCurrentSourceDirectory();
        tmp += "/";
        tmp += inc;
        inc = tmp;
      }
    }
  }
}